

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton5.cpp
# Opt level: O2

int main(void)

{
  (*(code *)es::init::singleton<Data<0U>,_es::init::early_initializer,_void,_std::ios_base::Init>::
            _get_instance._M_b._M_p)();
  (*(code *)es::init::singleton<Data<0U>,_es::init::early_initializer,_void,_std::ios_base::Init>::
            _get_instance._M_b._M_p)();
  (*(code *)es::init::singleton<Data<2U>,_es::init::early_initializer,_void,_std::ios_base::Init>::
            _get_instance._M_b._M_p)();
  (*(code *)es::init::singleton<Data<3U>,_es::init::early_initializer,_void,_std::ios_base::Init>::
            _get_instance._M_b._M_p)();
  test3();
  return 0;
}

Assistant:

int main()
{
    test1();
    test2();
    test3();

    return 0;
}